

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O0

void __thiscall
soul::CompileMessageList::addWarning(CompileMessageList *this,string *desc,CodeLocation *location)

{
  CompileMessage local_58;
  CodeLocation *local_20;
  CodeLocation *location_local;
  string *desc_local;
  CompileMessageList *this_local;
  
  local_20 = location;
  location_local = (CodeLocation *)desc;
  desc_local = (string *)this;
  std::__cxx11::string::string((string *)&local_58,(string *)desc);
  CodeLocation::CodeLocation(&local_58.location,location);
  local_58.type = warning;
  local_58.category = none;
  add(this,&local_58);
  CompileMessage::~CompileMessage(&local_58);
  return;
}

Assistant:

void CompileMessageList::addWarning (const std::string& desc, CodeLocation location)
{
    add ({ desc, location, CompileMessage::Type::warning });
}